

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadServiceWrapperBase.cpp
# Opt level: O0

void __thiscall
ThreadServiceWrapperBase::FinishIdleCollect(ThreadServiceWrapperBase *this,FinishReason reason)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  DWORD DVar4;
  Recycler *pRVar5;
  undefined4 *puVar6;
  FinishReason reason_local;
  ThreadServiceWrapperBase *this_local;
  
  if ((((reason != FinishReasonIdleTimerSetupFailed) && (reason != FinishReasonTaskComplete)) &&
      ((this->inIdleCollect & 1U) == 0)) &&
     (bVar2 = ThreadContext::IsInScript(this->threadContext), !bVar2)) {
    pRVar5 = ThreadContext::GetRecycler(this->threadContext);
    BVar3 = Memory::Recycler::CollectionInProgress(pRVar5);
    if (BVar3 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadServiceWrapperBase.cpp"
                         ,0xa4,
                         "(reason == FinishReason::FinishReasonIdleTimerSetupFailed || reason == FinishReason::FinishReasonTaskComplete || inIdleCollect || threadContext->IsInScript() || !threadContext->GetRecycler()->CollectionInProgress())"
                         ,
                         "reason == FinishReason::FinishReasonIdleTimerSetupFailed || reason == FinishReason::FinishReasonTaskComplete || inIdleCollect || threadContext->IsInScript() || !threadContext->GetRecycler()->CollectionInProgress()"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
  }
  if (((DAT_01ec73ca & 1) != 0) &&
     (bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,IdleCollectPhase), bVar2)) {
    DVar4 = GetCurrentThreadId();
    Output::Print(L"%04X> FinishIdleCollect- Reset hasScheduledIdleCollect\n",(ulong)DVar4);
    Output::Flush();
  }
  this->hasScheduledIdleCollect = false;
  this->needIdleCollect = false;
  (*(this->super_ThreadServiceWrapper)._vptr_ThreadServiceWrapper[5])();
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,IdleCollectPhase);
  if (bVar2) {
    DVar4 = GetCurrentThreadId();
    Output::Print(L"%04X> Idle timer finished\n",(ulong)DVar4);
    Output::Flush();
  }
  if (reason == FinishReasonTaskComplete) {
    pRVar5 = ThreadContext::GetRecycler(this->threadContext);
    BVar3 = Memory::Recycler::CollectionInProgress(pRVar5);
    if ((BVar3 != 0) && (bVar2 = ThreadContext::IsInScript(this->threadContext), !bVar2)) {
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,IdleCollectPhase);
      if (bVar2) {
        DVar4 = GetCurrentThreadId();
        Output::Print(L"%04X> FinishIdleCollect- collection is still in progress, schedule another timer to check the status\n"
                      ,(ulong)DVar4);
        Output::Flush();
      }
      ScheduleIdleCollect(this,500,false);
    }
  }
  return;
}

Assistant:

void ThreadServiceWrapperBase::FinishIdleCollect(ThreadServiceWrapperBase::FinishReason reason)
{
    Assert(reason == FinishReason::FinishReasonIdleTimerSetupFailed ||
        reason == FinishReason::FinishReasonTaskComplete ||
        inIdleCollect || threadContext->IsInScript() || !threadContext->GetRecycler()->CollectionInProgress());

    IDLE_COLLECT_VERBOSE_TRACE(_u("FinishIdleCollect- Reset hasScheduledIdleCollect\n"));
    hasScheduledIdleCollect = false;
    needIdleCollect = false;

    OnFinishIdleCollect();

    IDLE_COLLECT_TRACE(_u("Idle timer finished\n"));

    if (reason == FinishReason::FinishReasonTaskComplete 
        && threadContext->GetRecycler()->CollectionInProgress() 
        && !threadContext->IsInScript())
    {
        // schedule another timer to check the progress
        IDLE_COLLECT_TRACE(_u("FinishIdleCollect- collection is still in progress, schedule another timer to check the status\n"));
        // schedule a shorter timer here to check the progress since the idle GC has already last more than one second and is likely to close to finish
        // TODO: measure and adjust the timeout bellow
        ScheduleIdleCollect(RecyclerHeuristic::TickCountIdleCollectRepeatTimer, false);
    }
    else
    {
        JS_ETW(EventWriteJSCRIPT_GC_IDLE_FINISHED(this));
    }
}